

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

int __thiscall QUtcTimeZonePrivate::init(QUtcTimeZonePrivate *this,EVP_PKEY_CTX *ctx)

{
  QString *pQVar1;
  int in_EDX;
  Territory in_R9W;
  undefined6 in_stack_ffffffffffffffd0;
  
  QByteArray::operator=((QByteArray *)CONCAT26(in_R9W,in_stack_ffffffffffffffd0),(QByteArray *)this)
  ;
  this->m_offsetFromUtc = in_EDX;
  QString::operator=((QString *)CONCAT26(in_R9W,in_stack_ffffffffffffffd0),(QString *)this);
  QString::operator=((QString *)CONCAT26(in_R9W,in_stack_ffffffffffffffd0),(QString *)this);
  this->m_territory = in_R9W;
  pQVar1 = QString::operator=((QString *)CONCAT26(in_R9W,in_stack_ffffffffffffffd0),(QString *)this)
  ;
  return (int)pQVar1;
}

Assistant:

void QUtcTimeZonePrivate::init(const QByteArray &zoneId, int offsetSeconds, const QString &name,
                               const QString &abbreviation, QLocale::Territory territory,
                               const QString &comment)
{
    m_id = zoneId;
    m_offsetFromUtc = offsetSeconds;
    m_name = name;
    m_abbreviation = abbreviation;
    m_territory = territory;
    m_comment = comment;
}